

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O1

bool __thiscall wasm::I64ToI32Lowering::hasOutParam(I64ToI32Lowering *this,Expression *e)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  ulong uVar3;
  __node_base_ptr p_Var4;
  __node_base_ptr p_Var5;
  bool bVar6;
  
  uVar1 = (this->highBitVars)._M_h._M_bucket_count;
  uVar3 = (ulong)e % uVar1;
  p_Var4 = (this->highBitVars)._M_h._M_buckets[uVar3];
  p_Var5 = (__node_base_ptr)0x0;
  if ((p_Var4 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var4->_M_nxt, p_Var5 = p_Var4, (Expression *)p_Var4->_M_nxt[1]._M_nxt != e)) {
    while (p_Var4 = p_Var2, p_Var2 = p_Var4->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var5 = (__node_base_ptr)0x0;
      if (((ulong)p_Var2[1]._M_nxt % uVar1 != uVar3) ||
         (p_Var5 = p_Var4, (Expression *)p_Var2[1]._M_nxt == e)) goto LAB_008e2440;
    }
    p_Var5 = (__node_base_ptr)0x0;
  }
LAB_008e2440:
  if (p_Var5 == (__node_base_ptr)0x0) {
    bVar6 = false;
  }
  else {
    bVar6 = p_Var5->_M_nxt != (_Hash_node_base *)0x0;
  }
  return bVar6;
}

Assistant:

bool hasOutParam(Expression* e) {
    return highBitVars.find(e) != highBitVars.end();
  }